

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlFdClose(void *context)

{
  int iVar1;
  xmlParserErrors xVar2;
  int *piVar3;
  
  iVar1 = close(*context);
  (*xmlFree)(context);
  if (-1 < iVar1) {
    return 0;
  }
  piVar3 = __errno_location();
  xVar2 = xmlIOErr(*piVar3);
  return xVar2;
}

Assistant:

static int
xmlFdClose (void * context) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret;

    ret = close(fd);

    xmlFree(fdctxt);

    if (ret < 0)
        return(xmlIOErr(errno));

    return(XML_ERR_OK);
}